

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

string * google::protobuf::internal::SubMessagePrefix
                   (string *__return_storage_ptr__,string *prefix,FieldDescriptor *field,int index)

{
  bool bVar1;
  AlphaNum local_1a8;
  AlphaNum local_178;
  AlphaNum local_148;
  string_view local_118;
  AlphaNum local_108;
  AlphaNum local_d8;
  string_view local_a8;
  AlphaNum local_98;
  AlphaNum local_68;
  undefined1 local_25;
  int local_24;
  FieldDescriptor *pFStack_20;
  int index_local;
  FieldDescriptor *field_local;
  string *prefix_local;
  string *result;
  
  local_25 = 0;
  local_24 = index;
  pFStack_20 = field;
  field_local = (FieldDescriptor *)prefix;
  prefix_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  bVar1 = FieldDescriptor::is_extension(pFStack_20);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_68,"(");
    local_a8 = FieldDescriptor::full_name(pFStack_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_98,local_a8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,")");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_68,&local_98,&local_d8);
  }
  else {
    local_118 = FieldDescriptor::name(pFStack_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_108,local_118);
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_108);
  }
  if (local_24 != -1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_148,"[");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_178,local_24);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1a8,"]");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_148,&local_178,&local_1a8);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    absl::StrAppend(&result, "(", field->full_name(), ")");
  } else {
    absl::StrAppend(&result, field->name());
  }
  if (index != -1) {
    absl::StrAppend(&result, "[", index, "]");
  }
  result.append(".");
  return result;
}